

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

void Abc_NtkSetAndGateDelay(Abc_Frame_t *pAbc,float Delay)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pNtk;
  float Delay_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  else {
    pAVar1 = Abc_FrameReadNtk(pAbc);
    if (pAVar1 == (Abc_Ntk_t *)0x0) {
      printf("Current network in ABC framework is not defined.\n");
    }
    else {
      pAVar1->AndGateDelay = Delay;
    }
  }
  return;
}

Assistant:

void Abc_NtkSetAndGateDelay( Abc_Frame_t * pAbc, float Delay )
{
    //Abc_Frame_t * pAbc = (Abc_Frame_t *)pAbc0;
    Abc_Ntk_t * pNtk;
    if ( pAbc == NULL )
    {
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
        return;
    }
    pNtk = Abc_FrameReadNtk( pAbc );
    if ( pNtk == NULL )
    {
        printf( "Current network in ABC framework is not defined.\n" );
        return;
    }
    pNtk->AndGateDelay = Delay;
}